

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model_cleanEncapsulatedModel_Test::Model_cleanEncapsulatedModel_Test
          (Model_cleanEncapsulatedModel_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00134988;
  return;
}

Assistant:

TEST(Model, cleanEncapsulatedModel)
{
    // Make a model with empty components and empty import sources.
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"dirtyModel\">\n"
        "  <component name=\"component\"/>\n"
        "  <component name=\"emptyChildComponent\"/>\n"
        "  <component name=\"nonEmptyComponent\">\n"
        "    <variable name=\"x\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"component\">\n"
        "      <component_ref component=\"emptyChildComponent\"/>\n"
        "      <component_ref component=\"nonEmptyComponent\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("dirty_encapsulated_model.cellml"));
    auto printer = libcellml::Printer::create();

    model->clean();

    EXPECT_EQ(e, printer->printModel(model));
}